

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::InitScopeSlotArray(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint uVar1;
  Symbol *pSVar2;
  code *pcVar3;
  Symbol *this_00;
  bool bVar4;
  BOOL BVar5;
  PropertyId PVar6;
  undefined4 *puVar7;
  Scope *pSVar8;
  FunctionBody *this_01;
  Recycler *this_02;
  char *ptr;
  UINT i;
  ulong uVar9;
  Type TVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  pSVar8 = funcInfo->paramScope;
  uVar1 = funcInfo->bodyScope->scopeSlotCount;
  uVar12 = (ulong)uVar1;
  TVar10 = 0;
  data._32_8_ = this;
  if (pSVar8 != (Scope *)0x0) {
    if ((pSVar8->scopeSlotCount != 0) && ((*(uint *)&funcInfo->field_0xb4 & 0x8000) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x717,
                         "(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope)"
                         ,
                         "funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope"
                        );
      if (!bVar4) goto LAB_00801300;
      *puVar7 = 0;
      pSVar8 = funcInfo->paramScope;
      TVar10 = 0;
      if (pSVar8 == (Scope *)0x0) goto LAB_00800fd6;
    }
    TVar10 = pSVar8->scopeSlotCount;
  }
LAB_00800fd6:
  if (TVar10 != 0 || uVar1 != 0) {
    this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
    (this_01->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
    (this_01->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar10;
    if (uVar1 == 0) {
      return;
    }
    local_70 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_35efead;
    data.filename._0_4_ = 0x728;
    data.plusSize = uVar12;
    this_02 = Memory::Recycler::TrackAllocInfo
                        (*(Recycler **)(*(long *)data._32_8_ + 0x1200),(TrackAllocData *)local_70);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00801300;
      *puVar7 = 0;
    }
    ptr = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                    (this_02,uVar12 * 4);
    if (ptr == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00801300;
      *puVar7 = 0;
    }
    (this_01->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
    (this_01->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar10;
    Js::FunctionProxy::SetAuxPtr((FunctionProxy *)this_01,PropertyIdsForScopeSlotArray,ptr);
    if ((((this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x50) == 0x10) &&
       ((this_01->super_ParseableFunctionInfo).scopeSlotArraySize != uVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x72b,
                         "(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount)"
                         ,"The slot array size is different between debug and non-debug mode");
      if (!bVar4) {
LAB_00801300:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    memset(ptr,0xff,uVar12 * 4);
    pSVar2 = funcInfo->bodyScope->m_symList;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while (this_00 = pSVar2, this_00 != (Symbol *)0x0) {
      pSVar2 = this_00->next;
      bVar4 = Symbol::NeedsSlotAlloc(this_00,(ByteCodeGenerator *)data._32_8_,funcInfo);
      if (bVar4) {
        uVar11 = this_00->scopeSlot;
        if (uVar11 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x742,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
          if (!bVar4) goto LAB_00801300;
          *puVar7 = 0;
          uVar11 = this_00->scopeSlot;
        }
        PVar6 = Symbol::EnsurePosition(this_00,funcInfo);
        if (((int)uVar11 < 0) || (uVar1 <= uVar11)) {
          Js::Throw::FatalInternalError(-0x7fffbffb);
        }
        *(PropertyId *)(ptr + (ulong)uVar11 * 4) = PVar6;
      }
    }
    uVar9 = 0;
    do {
      if ((*(int *)(ptr + uVar9 * 4) == -1) && (funcInfo->frameObjRegister == 0xffffffff)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x74d,
                           "(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                           ,
                           "propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister"
                          );
        if (!bVar4) goto LAB_00801300;
        *puVar7 = 0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitScopeSlotArray(FuncInfo * funcInfo)
{
    // Record slots info for ScopeSlots/ScopeObject.
    uint scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
    bool isSplitScope = !funcInfo->IsBodyAndParamScopeMerged();
    Assert(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope);
    uint scopeSlotCountForParamScope = funcInfo->paramScope != nullptr ? funcInfo->paramScope->GetScopeSlotCount() : 0;

    if (scopeSlotCount == 0 && scopeSlotCountForParamScope == 0)
    {
        return;
    }

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    if (scopeSlotCount > 0 || scopeSlotCountForParamScope > 0)
    {
        byteCodeFunction->SetScopeSlotArraySizes(scopeSlotCount, scopeSlotCountForParamScope);
    }

    // TODO: Need to add property ids for the case when scopeSlotCountForParamSCope is non-zero
    if (scopeSlotCount)
    {
        Js::PropertyId *propertyIdsForScopeSlotArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), Js::PropertyId, scopeSlotCount);
        byteCodeFunction->SetPropertyIdsForScopeSlotArray(propertyIdsForScopeSlotArray, scopeSlotCount, scopeSlotCountForParamScope);
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount,
            "The slot array size is different between debug and non-debug mode");
#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            propertyIdsForScopeSlotArray[i] = Js::Constants::NoProperty;
        }
#endif
        auto setPropertyIdForScopeSlotArray =
            [scopeSlotCount, propertyIdsForScopeSlotArray]
            (Js::PropertyId slot, Js::PropertyId propId)
        {
            if (slot < 0 || (uint)slot >= scopeSlotCount)
            {
                Js::Throw::FatalInternalError();
            }
            propertyIdsForScopeSlotArray[slot] = propId;
        };

        auto setPropIdsForScopeSlotArray = [this, funcInfo, setPropertyIdForScopeSlotArray](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                Assert(sym->HasScopeSlot()); // We can't allocate scope slot now. Any symbol needing scope slot must have allocated it before this point.
                setPropertyIdForScopeSlotArray(sym->GetScopeSlot(), sym->EnsurePosition(funcInfo));
            }
        };

        funcInfo->GetBodyScope()->ForEachSymbol(setPropIdsForScopeSlotArray);

#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            Assert(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty
                || funcInfo->frameObjRegister != Js::Constants::NoRegister); // ScopeObject may have unassigned entries, e.g. for same-named parameters
        }
#endif
    }
}